

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O1

word Sbd_ManSolve(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivSet,Vec_Int_t *vDivVars,
                 Vec_Int_t *vDivValues,Vec_Int_t *vTemp)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  word wVar11;
  uint local_50;
  uint local_4c;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  word local_38;
  
  iVar6 = sat_solver_nvars(pSat);
  if (iVar6 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0xb7,
                  "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (vDivVars->nSize != vDivValues->nSize) {
    __assert_fail("Vec_IntSize(vDivVars) == Vec_IntSize(vDivValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                  ,0xb8,
                  "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if ((PivotVar < 0) || (local_50 = PivotVar * 2, FreeVar < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_4c = FreeVar * 2;
  uVar10 = 0;
  local_48 = vDivVars;
  local_40 = vDivValues;
  do {
    pVVar5 = local_40;
    pVVar4 = local_48;
    iVar6 = sat_solver_solve(pSat,(lit *)&local_50,(lit *)&local_48,0,0,0,0);
    if (iVar6 != 1) {
      if (iVar6 == -1) {
        return uVar10;
      }
      if (iVar6 == 0) {
        return 0x1234567812345678;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                    ,0xc3,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (0 < pVVar4->nSize) {
      piVar3 = pVVar4->pArray;
      lVar8 = 0;
      do {
        iVar6 = piVar3[lVar8];
        if (((long)iVar6 < 0) || (pSat->size <= iVar6)) goto LAB_00546f5e;
        if (pVVar5->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar5->pArray[lVar8] = (uint)(pSat->model[iVar6] == 1) * 2;
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar4->nSize);
    }
    vTemp->nSize = 0;
    if ((int)local_50 < 0) goto LAB_00546ff9;
    Vec_IntPush(vTemp,local_50 ^ 1);
    if (0 < vDivSet->nSize) {
      lVar8 = 0;
      do {
        iVar6 = vDivSet->pArray[lVar8];
        if (((long)iVar6 < 0) || (pSat->size <= iVar6)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
        }
        Vec_IntPush(vTemp,(uint)(pSat->model[iVar6] != 1) + iVar6 * 2);
        lVar8 = lVar8 + 1;
      } while (lVar8 < vDivSet->nSize);
    }
    iVar6 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,0,0,0,0);
    if (iVar6 != -1) {
      wVar11 = 0x1234567812345678;
      if (iVar6 != 0) {
        if (iVar6 != 1) {
          __assert_fail("status == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                        ,0xd2,
                        "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (0 < local_48->nSize) {
          piVar3 = local_48->pArray;
          lVar8 = 0;
          do {
            iVar6 = piVar3[lVar8];
            if (((long)iVar6 < 0) || (pSat->size <= iVar6)) {
LAB_00546f5e:
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            if (pVVar5->nSize <= lVar8) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            pVVar5->pArray[lVar8] = pVVar5->pArray[lVar8] + (uint)(pSat->model[iVar6] == 1);
            lVar8 = lVar8 + 1;
          } while (lVar8 < local_48->nSize);
        }
        wVar11 = 0x8765432187654321;
        if (0 < pVVar5->nSize) {
          piVar3 = pVVar5->pArray;
          lVar8 = 0;
          do {
            piVar3[lVar8] = piVar3[lVar8] + 0xc;
            lVar8 = lVar8 + 1;
          } while (lVar8 < pVVar5->nSize);
        }
      }
      return wVar11;
    }
    piVar3 = (pSat->conf_final).ptr;
    uVar1 = (pSat->conf_final).size;
    vTemp->nSize = 0;
    if ((int)local_4c < 0) {
LAB_00546ff9:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    local_38 = uVar10;
    Vec_IntPush(vTemp,local_4c ^ 1);
    uVar10 = 0xffffffffffffffff;
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        uVar2 = piVar3[uVar9];
        if (uVar2 != local_50) {
          Vec_IntPush(vTemp,uVar2);
          uVar2 = piVar3[uVar9];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar7 = 0xffffffff;
          if (0 < (long)vDivSet->nSize) {
            lVar8 = 0;
            do {
              if (vDivSet->pArray[lVar8] == uVar2 >> 1) {
                uVar7 = (uint)lVar8;
                break;
              }
              lVar8 = lVar8 + 1;
            } while (vDivSet->nSize != lVar8);
          }
          if ((int)uVar7 < 0) {
            __assert_fail("iVar >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                          ,0xdd,
                          "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          uVar10 = uVar10 & ((ulong)(uVar2 & 1) - 1 ^ s_Truths6[uVar7]);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
    iVar6 = sat_solver_addclause(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize);
    uVar10 = local_38 | uVar10;
    if (iVar6 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                    ,0xe2,
                    "word Sbd_ManSolve(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
  } while( true );
}

Assistant:

word Sbd_ManSolve( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivSet, Vec_Int_t * vDivVars, Vec_Int_t * vDivValues, Vec_Int_t * vTemp )
{
    int nBTLimit = 0;
    word uCube, uTruth = 0;
    int status, i, iVar, nFinal, * pFinal, pLits[2], nIter = 0;
    assert( FreeVar < sat_solver_nvars(pSat) );
    assert( Vec_IntSize(vDivVars) == Vec_IntSize(vDivValues) );
    pLits[0] = Abc_Var2Lit( PivotVar, 0 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SBD_SAT_UNDEC;
        if ( status == l_False )
            return uTruth;
        assert( status == l_True );
        // remember variable values
        Vec_IntForEachEntry( vDivVars, iVar, i )
            Vec_IntWriteEntry( vDivValues, i, 2*sat_solver_var_value(pSat, iVar) );
        // collect divisor literals
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( vDivSet, iVar, i )
            Vec_IntPush( vTemp, sat_solver_var_literal(pSat, iVar) );
        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SBD_SAT_UNDEC;
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        uCube = ~(word)0;
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( vTemp, pFinal[i] );
            iVar = Vec_IntFind( vDivSet, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp) );
        assert( status );
        nIter++;
    }
    assert( status == l_True );
    // store the counter-example
    Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntAddToEntry( vDivValues, i, sat_solver_var_value(pSat, iVar) );

    for ( i = 0; i < Vec_IntSize(vDivValues); i++ )
        Vec_IntAddToEntry( vDivValues, i, 0xC );
/*
    // reduce the counter example
    for ( n = 0; n < 2; n++ )
    {
        Vec_IntClear( vTemp );
        Vec_IntPush( vTemp, Abc_Var2Lit(PivotVar, n) ); // n = 0 => F = 1  (expanding offset against onset)
        for ( i = 0; i < Vec_IntSize(vValues); i++ )
            Vec_IntPush( vTemp, Abc_Var2Lit(i, !((Vec_IntEntry(vValues, i) >> n) & 1)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntArray(vTemp) + Vec_IntSize(vTemp), nBTLimit, 0, 0, 0 );
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( pSat, &pFinal );
        for ( i = 0; i < nFinal; i++ )
            if ( Abc_Lit2Var(pFinal[i]) != PivotVar )
                Vec_IntAddToEntry( vValues, Abc_Lit2Var(pFinal[i]), 1 << (n+2) );
    }
*/
    return SBD_SAT_SAT;
}